

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_DonatePartialCordBuffer_Test::TestBody
          (CordOutputStreamTest_DonatePartialCordBuffer_Test *this)

{
  byte bVar1;
  bool bVar2;
  CordRepFlat *pCVar3;
  undefined8 extraout_RAX;
  sbyte sVar4;
  sbyte sVar5;
  ulong uVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  uint uVar8;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar9;
  pointer message;
  char *pcVar10;
  int iVar11;
  pointer *__ptr;
  Span<char> SVar12;
  AssertionResult gtest_ar;
  CordBuffer buffer;
  string_view fragment;
  AssertionResult gtest_ar_;
  Cord cord;
  void *available_data;
  CordOutputStream output;
  AssertHelper local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_b9f6da03_for_Rep_1 local_b8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  undefined1 auStack_70 [17];
  undefined4 local_5f;
  undefined2 local_5b;
  char local_59;
  undefined1 local_50 [16];
  Cord local_40 [2];
  byte local_20;
  undefined7 uStack_1f;
  
  pCVar3 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  (pCVar3->super_CordRep).length = 0;
  local_b8.short_rep.raw_size = (char)pCVar3;
  local_b8._1_7_ = (undefined7)((ulong)pCVar3 >> 8);
  if (((ulong)pCVar3 & 1) == 0) {
    SVar12 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_b8.long_rep);
    local_50._0_8_ = SVar12.ptr_;
  }
  else {
    SVar12 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_b8.long_rep);
    local_50._0_8_ = SVar12.ptr_;
  }
  (((CordRepFlat *)(local_50._0_8_ + 0x50))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x50))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x40))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x40))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x30))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x30))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x20))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x20))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)(local_50._0_8_ + 0x10))->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)(local_50._0_8_ + 0x10))->super_CordRep).refcount =
       0x6161616161616161;
  (((CordRepFlat *)local_50._0_8_)->super_CordRep).length = 0x6161616161616161;
  *(undefined8 *)&(((CordRepFlat *)local_50._0_8_)->super_CordRep).refcount = 0x6161616161616161;
  *(undefined4 *)&(((CordRepFlat *)(local_50._0_8_ + 0x60))->super_CordRep).length = 0x61616161;
  if ((local_b8.short_rep.raw_size & 1U) != 0) {
LAB_00b5bee8:
    io::_GLOBAL__N_1::CordOutputStreamTest_DonatePartialCordBuffer_Test::TestBody();
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_78);
    CordOutputStream::~CordOutputStream((CordOutputStream *)(local_50 + 8));
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_b8.long_rep);
    _Unwind_Resume(extraout_RAX);
  }
  bVar1 = *(byte *)(CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size) + 0xc);
  uVar8 = 0xfff48000;
  if (bVar1 < 0xbb) {
    uVar8 = 0xfffff180;
  }
  sVar5 = 0xc;
  if (bVar1 < 0xbb) {
    sVar5 = 6;
  }
  pcVar10 = (char *)0xfffffff0;
  if (0x42 < bVar1) {
    pcVar10 = (char *)(ulong)uVar8;
  }
  sVar4 = 3;
  if (0x42 < bVar1) {
    sVar4 = sVar5;
  }
  if ((((uint)bVar1 << sVar4) + (int)pcVar10) - 0xd < 100) goto LAB_00b5bee8;
  if ((local_b8.short_rep.raw_size & 1U) == 0) {
    lVar7 = *(long *)CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size);
  }
  else {
    lVar7 = (long)(local_b8.short_rep.raw_size >> 1);
  }
  uVar6 = 0xf;
  if ((local_b8.short_rep.raw_size & 1U) == 0) {
    bVar1 = *(byte *)(CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size) + 0xc);
    iVar9 = -0xb8000;
    if (bVar1 < 0xbb) {
      iVar9 = -0xe80;
    }
    pcVar10 = &DAT_0000000c;
    if (bVar1 < 0xbb) {
      pcVar10 = &DAT_00000006;
    }
    iVar11 = -0x10;
    if (0x42 < bVar1) {
      iVar11 = iVar9;
    }
    sVar5 = 3;
    if (0x42 < bVar1) {
      sVar5 = (sbyte)pcVar10;
    }
    uVar6 = (ulong)(int)(((uint)bVar1 << sVar5) + iVar11 + -0xd);
  }
  if (uVar6 < lVar7 + 100U) goto LAB_00b5bee8;
  if ((local_b8.short_rep.raw_size & 1U) == 0) {
    *(long *)CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size) =
         *(long *)CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size) + 100;
  }
  else {
    local_b8.short_rep.raw_size = local_b8.short_rep.raw_size - 0x38;
  }
  auStack_70[8] = local_b8.short_rep.raw_size;
  auStack_70._9_7_ = local_b8._1_7_;
  local_5f = local_b8._9_4_;
  local_5b = local_b8._13_2_;
  local_59 = local_b8.short_rep.data[0xe];
  local_b8.short_rep.raw_size = 1;
  CordOutputStream::CordOutputStream
            ((CordOutputStream *)(local_50 + 8),(CordBuffer *)(auStack_70 + 8),0);
  if ((auStack_70[8] & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(auStack_70._9_7_,auStack_70[8]));
  }
  CordOutputStream::Consume((CordOutputStream *)local_78);
  bVar2 = true;
  if ((Nonnull<CordRep_*>)auStack_70._0_8_ != (Nonnull<CordRep_*>)0x0 && (local_78[0] & 1) != 0) {
    local_a8 = (undefined1  [8])0x0;
    pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar2 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_70._0_8_,(Nonnull<absl::string_view_*>)local_a8);
  }
  local_88[0] = bVar2;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_80;
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)local_88,(AssertionResult *)"cord.TryFlat()","false",
               "true",pcVar10);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x407,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
        != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
    __ptr_00 = local_80;
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5be9e;
  }
  else {
    if ((Nonnull<CordRep_*>)auStack_70._0_8_ == (Nonnull<CordRep_*>)0x0 ||
        ((long)(char)local_78[0] & 1U) == 0) {
      if ((local_78[0] & 1) == 0) {
        local_a8 = (undefined1  [8])((ulong)(long)(char)local_78[0] >> 1);
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + 1);
      }
      else {
        local_a8 = *(undefined1 (*) [8])auStack_70._0_8_;
        local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_a8 = (undefined1  [8])0x0;
      pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_70._0_8_,(Nonnull<absl::string_view_*>)local_a8);
      local_80 = pbStack_a0;
    }
    local_88 = local_a8;
    local_a8 = (undefined1  [8])&local_98;
    std::__cxx11::string::_M_construct((ulong)local_a8,'d');
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)&local_c8,"flat","std::string(100, \'a\')",
               (basic_string_view<char,_std::char_traits<char>_> *)local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,local_98._M_allocated_capacity + 1);
    }
    if (local_c8._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_a8);
      if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar10 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar10 = (local_c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x409,pcVar10);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if (local_a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_a8 + 8))();
      }
    }
    if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,local_c0);
    }
    local_c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_a8,"flat.data()","available_data",(char **)&local_c8,
               (void **)local_50);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_c8);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x40a,message);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._M_head_impl
          != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_c8._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5be9e;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_a0;
    __ptr_00 = pbStack_a0;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00b5be9e:
  absl::lts_20250127::Cord::~Cord((Cord *)local_78);
  if ((local_20 & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)CONCAT71(uStack_1f,local_20));
  }
  absl::lts_20250127::Cord::~Cord(local_40);
  if ((local_b8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_b8._1_7_,local_b8.short_rep.raw_size));
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}